

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O3

void Frc_ManPrintStats(Frc_Man_t *p)

{
  printf("i/o =%7d/%7d  ",(ulong)(uint)(p->vCis->nSize - p->nRegs),
         (ulong)(uint)(p->vCos->nSize - p->nRegs));
  if (p->nRegs != 0) {
    printf("ff =%7d  ");
  }
  printf("node =%8d  ",(ulong)(uint)(p->nObjs - (p->vCis->nSize + p->vCos->nSize)));
  printf("obj =%8d  ",(ulong)(uint)p->nObjs);
  printf("mem =%5.2f MB",(double)p->nObjData * 4.0 * 9.5367431640625e-07);
  putchar(10);
  return;
}

Assistant:

void Frc_ManPrintStats( Frc_Man_t * p )
{
//    if ( p->pName )
//        printf( "%8s : ", p->pName );
    printf( "i/o =%7d/%7d  ", Frc_ManPiNum(p), Frc_ManPoNum(p) );
    if ( Frc_ManRegNum(p) )
        printf( "ff =%7d  ", Frc_ManRegNum(p) );
    printf( "node =%8d  ", Frc_ManNodeNum(p) );
    printf( "obj =%8d  ", Frc_ManObjNum(p) );
//    printf( "lev =%5d  ", Frc_ManLevelNum(p) );
//    printf( "cut =%5d  ", Frc_ManCrossCut(p) );
    printf( "mem =%5.2f MB", 4.0*p->nObjData/(1<<20) );
//    printf( "obj =%5d  ", Frc_ManObjNum(p) );
    printf( "\n" );
}